

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2any.c
# Opt level: O0

void free_asn1_data(int type,void *data)

{
  ASN1_OBJECT *in_RSI;
  int in_EDI;
  
  if (in_EDI == 6) {
    ASN1_OBJECT_free(in_RSI);
  }
  else if (in_EDI == 0x10) {
    ASN1_STRING_free((ASN1_STRING *)in_RSI);
  }
  return;
}

Assistant:

static void free_asn1_data(int type, void *data)
{
    switch(type) {
    case V_ASN1_OBJECT:
        ASN1_OBJECT_free(data);
        break;
    case V_ASN1_SEQUENCE:
        ASN1_STRING_free(data);
        break;
    }
}